

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O2

void __thiscall capnp::SchemaLoader::Impl::Impl(Impl *this,SchemaLoader *loader)

{
  kj::Arena::Arena(&this->arena,0x400);
  (this->dedupTable).
  super_Table<kj::ArrayPtr<const_unsigned_char>,_kj::HashIndex<kj::_::HashSetCallbacks>_>.rows.
  builder.ptr = (ArrayPtr<const_unsigned_char> *)0x0;
  (this->dedupTable).
  super_Table<kj::ArrayPtr<const_unsigned_char>,_kj::HashIndex<kj::_::HashSetCallbacks>_>.rows.
  builder.pos = (RemoveConst<kj::ArrayPtr<const_unsigned_char>_> *)0x0;
  (this->dedupTable).
  super_Table<kj::ArrayPtr<const_unsigned_char>,_kj::HashIndex<kj::_::HashSetCallbacks>_>.rows.
  builder.endPtr = (ArrayPtr<const_unsigned_char> *)0x0;
  (this->structSizeRequirements).table.indexes.erasedCount = 0;
  (this->structSizeRequirements).table.indexes.buckets.ptr = (HashBucket *)0x0;
  (this->structSizeRequirements).table.indexes.buckets.size_ = 0;
  (this->structSizeRequirements).table.indexes.buckets.disposer = (ArrayDisposer *)0x0;
  (this->dedupTable).
  super_Table<kj::ArrayPtr<const_unsigned_char>,_kj::HashIndex<kj::_::HashSetCallbacks>_>.indexes.
  erasedCount = 0;
  (this->dedupTable).
  super_Table<kj::ArrayPtr<const_unsigned_char>,_kj::HashIndex<kj::_::HashSetCallbacks>_>.indexes.
  buckets.ptr = (HashBucket *)0x0;
  (this->dedupTable).
  super_Table<kj::ArrayPtr<const_unsigned_char>,_kj::HashIndex<kj::_::HashSetCallbacks>_>.indexes.
  buckets.size_ = 0;
  (this->dedupTable).
  super_Table<kj::ArrayPtr<const_unsigned_char>,_kj::HashIndex<kj::_::HashSetCallbacks>_>.indexes.
  buckets.disposer = (ArrayDisposer *)0x0;
  (this->schemas).table.rows.builder.ptr = (Entry *)0x0;
  (this->schemas).table.rows.builder.pos =
       (RemoveConst<kj::HashMap<unsigned_long,_capnp::_::RawSchema_*>::Entry> *)0x0;
  (this->schemas).table.rows.builder.endPtr = (Entry *)0x0;
  (this->schemas).table.indexes.erasedCount = 0;
  (this->schemas).table.indexes.buckets.ptr = (HashBucket *)0x0;
  (this->brands).table.rows.builder.endPtr = (Entry *)0x0;
  (this->schemas).table.indexes.buckets.size_ = 0;
  (this->schemas).table.indexes.buckets.disposer = (ArrayDisposer *)0x0;
  (this->brands).table.rows.builder.ptr = (Entry *)0x0;
  (this->brands).table.rows.builder.pos =
       (RemoveConst<kj::HashMap<capnp::(anonymous_namespace)::SchemaBindingsPair,_capnp::_::RawBrandedSchema_*>::Entry>
        *)0x0;
  (this->brands).table.indexes.erasedCount = 0;
  (this->brands).table.indexes.buckets.ptr = (HashBucket *)0x0;
  (this->brands).table.indexes.buckets.size_ = 0;
  (this->brands).table.indexes.buckets.disposer = (ArrayDisposer *)0x0;
  (this->unboundBrands).table.rows.builder.ptr = (Entry *)0x0;
  (this->unboundBrands).table.rows.builder.pos =
       (RemoveConst<kj::HashMap<const_capnp::_::RawSchema_*,_capnp::_::RawBrandedSchema_*>::Entry> *
       )0x0;
  (this->unboundBrands).table.rows.builder.endPtr = (Entry *)0x0;
  (this->structSizeRequirements).table.rows.builder.ptr = (Entry *)0x0;
  (this->structSizeRequirements).table.rows.builder.pos =
       (RemoveConst<kj::HashMap<unsigned_long,_capnp::SchemaLoader::Impl::RequiredSize>::Entry> *)
       0x0;
  (this->structSizeRequirements).table.rows.builder.endPtr = (Entry *)0x0;
  (this->unboundBrands).table.indexes.buckets.size_ = 0;
  (this->unboundBrands).table.indexes.buckets.disposer = (ArrayDisposer *)0x0;
  (this->unboundBrands).table.indexes.erasedCount = 0;
  (this->unboundBrands).table.indexes.buckets.ptr = (HashBucket *)0x0;
  (this->initializer).super_Initializer._vptr_Initializer = (_func_int **)&PTR_init_0030c9a0;
  (this->initializer).loader = loader;
  (this->initializer).callback.ptr = (LazyLoadCallback *)0x0;
  (this->brandedInitializer).super_Initializer._vptr_Initializer = (_func_int **)&PTR_init_0030c9d0;
  (this->brandedInitializer).loader = loader;
  return;
}

Assistant:

inline explicit Impl(const SchemaLoader& loader)
      : initializer(loader), brandedInitializer(loader) {}